

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCue_SetVariable(FACTCue *pCue,uint16_t nIndex,float nValue)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  byte *pbVar4;
  ushort in_SI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FACTVariable *var;
  float local_34;
  float local_30;
  uint32_t local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else if (in_SI == 0xffff) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x116ccc);
    pbVar4 = (byte *)(*(long *)(*(long *)*in_RDI + 0x58) + (ulong)in_SI * 0x10);
    do {
      if ((*pbVar4 & 1) != 0) goto LAB_00116d45;
      iVar2 = SDL_ReportAssertion(&FACTCue_SetVariable::sdl_assert_data,"FACTCue_SetVariable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                  ,0xae2);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00116d45:
    do {
      if ((*pbVar4 & 2) == 0) goto LAB_00116d9e;
      iVar2 = SDL_ReportAssertion(&FACTCue_SetVariable::sdl_assert_data_1,"FACTCue_SetVariable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                  ,0xae3);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00116d9e:
    do {
      if ((*pbVar4 & 4) != 0) goto LAB_00116df1;
      iVar2 = SDL_ReportAssertion(&FACTCue_SetVariable::sdl_assert_data_2,"FACTCue_SetVariable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                  ,0xae4);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00116df1:
    if (in_XMM0_Da < *(float *)(pbVar4 + 0xc) || in_XMM0_Da == *(float *)(pbVar4 + 0xc)) {
      local_34 = in_XMM0_Da;
      if (in_XMM0_Da < *(float *)(pbVar4 + 8)) {
        local_34 = *(float *)(pbVar4 + 8);
      }
      local_30 = local_34;
    }
    else {
      local_30 = *(float *)(pbVar4 + 0xc);
    }
    *(float *)(in_RDI[6] + (ulong)in_SI * 4) = local_30;
    FAudio_PlatformUnlockMutex((FAudioMutex)0x116e83);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTCue_SetVariable(
	FACTCue *pCue,
	uint16_t nIndex,
	float nValue
) {
	FACTVariable *var;
	if (pCue == NULL)
	{
		return 1;
	}

	if (nIndex == FACTINDEX_INVALID)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	var = &pCue->parentBank->parentEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(!(var->accessibility & 0x02));
	FAudio_assert(var->accessibility & 0x04);
	pCue->variableValues[nIndex] = FAudio_clamp(
		nValue,
		var->minValue,
		var->maxValue
	);

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}